

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

parser_error parse_entry_priority(parser *p)

{
  int iVar1;
  wchar_t local_58;
  long local_50;
  long v;
  char *end;
  wchar_t i;
  wchar_t n;
  wchar_t priority;
  wchar_t psource_index;
  char *name;
  embryonic_ui_entry *embryo;
  parser *p_local;
  
  embryo = (embryonic_ui_entry *)p;
  name = (char *)parser_priv(p);
  n = L'\0';
  i = L'\0';
  end._4_4_ = L'\x03';
  if (name == (char *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _priority = parser_getstr((parser *)embryo,"priority");
    for (end._0_4_ = L'\x01'; (wchar_t)end < end._4_4_; end._0_4_ = (wchar_t)end + L'\x01') {
      iVar1 = strcmp(_priority,priority_schemes[(wchar_t)end].name);
      if (iVar1 == 0) {
        if ((name[0x1c] & 1U) == 0) {
          n = (wchar_t)end;
        }
        else {
          i = (*priority_schemes[(wchar_t)end].priority)(*(wchar_t *)(*(long *)name + 0x1b4));
        }
        goto LAB_0023f335;
      }
    }
    local_50 = strtol(_priority,(char **)&v,10);
    if ((*_priority == '\0') || (*(char *)v != '\0')) {
      p_local._4_4_ = PARSE_ERROR_NOT_NUMBER;
    }
    else {
      if (local_50 < 0x80000000) {
        if (local_50 < -0x80000000) {
          local_50 = -0x80000000;
        }
        local_58 = (wchar_t)local_50;
      }
      else {
        local_58 = L'\x7fffffff';
      }
      i = local_58;
LAB_0023f335:
      if (*(int *)(name + 0x18) == -1) {
        *(wchar_t *)(name + 0x14) = n;
        *(wchar_t *)(*(long *)name + 0x1b0) = i;
      }
      else if ((name[0x1c] & 1U) == 0) {
        *(wchar_t *)(*(long *)(name + 8) + (long)*(int *)(name + 0x18) * 0x18 + 8) = n;
        *(wchar_t *)(*(long *)(name + 8) + (long)*(int *)(name + 0x18) * 0x18 + 0xc) = i;
        *(undefined1 *)(*(long *)(name + 8) + (long)*(int *)(name + 0x18) * 0x18 + 0x10) = 1;
      }
      else {
        *(wchar_t *)(*(long *)(*(long *)name + 8) + (long)*(int *)(name + 0x18) * 0x10 + 8) = i;
        *(undefined1 *)(*(long *)(*(long *)name + 8) + (long)*(int *)(name + 0x18) * 0x10 + 0xc) = 1
        ;
      }
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_entry_priority(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	int psource_index = 0;
	int priority = 0;
	int n = N_ELEMENTS(priority_schemes);
	int i;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "priority");
	i = 1;
	while (1) {
		if (i >= n) {
			char *end;
			long v;

			v = strtol(name, &end, 10);
			if (! *name || *end) {
				return PARSE_ERROR_NOT_NUMBER;
			}
			priority = (v <= INT_MAX) ?
				((v >= INT_MIN) ? v : INT_MIN) : INT_MAX;
			break;
		}
		if (streq(name, priority_schemes[i].name)) {
			if (embryo->exists) {
				priority = (*priority_schemes[i].priority)(
					embryo->entry->param_index);
			} else {
				psource_index = i;
			}
			break;
		}
		++i;
	}
	if (embryo->last_category_index == -1) {
		embryo->psource_index = psource_index;
		embryo->entry->default_priority = priority;
	} else {
		if (embryo->exists) {
			embryo->entry->categories[embryo->last_category_index].priority = priority;
			embryo->entry->categories[embryo->last_category_index].priority_set = true;
		} else {
			embryo->categories[embryo->last_category_index].psource_index = psource_index;
			embryo->categories[embryo->last_category_index].priority = priority;
			embryo->categories[embryo->last_category_index].priority_set = true;
		}
	}
	return PARSE_ERROR_NONE;
}